

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O2

void __thiscall HinOut::getData(HinOut *this,HModel *ptr_model)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ptr_model->numCol;
  this->onumCol = iVar1;
  iVar2 = ptr_model->numRow;
  this->onumRow = iVar2;
  this->onumTot = iVar2 + iVar1;
  std::vector<int,_std::allocator<int>_>::operator=(&this->oAstart,&ptr_model->Astart);
  std::vector<int,_std::allocator<int>_>::operator=(&this->oAindex,&ptr_model->Aindex);
  std::vector<double,_std::allocator<double>_>::operator=(&this->oAvalue,&ptr_model->Avalue);
  std::vector<double,_std::allocator<double>_>::operator=(&this->ocolCost,&ptr_model->colCost);
  std::vector<double,_std::allocator<double>_>::operator=(&this->ocolLower,&ptr_model->colLower);
  std::vector<double,_std::allocator<double>_>::operator=(&this->ocolUpper,&ptr_model->colUpper);
  std::vector<double,_std::allocator<double>_>::operator=(&this->orowLower,&ptr_model->rowLower);
  std::vector<double,_std::allocator<double>_>::operator=(&this->orowUpper,&ptr_model->rowUpper);
  this->oAcountX =
       (int)((ulong)((long)(this->oAvalue).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->oAvalue).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3);
  return;
}

Assistant:

void HinOut::getData(HModel & ptr_model) {
	onumCol = ptr_model.numCol;
    onumRow = ptr_model.numRow;
    onumTot = ptr_model.numCol + ptr_model.numRow;
    oAstart = ptr_model.Astart;
    oAindex = ptr_model.Aindex;
    oAvalue = ptr_model.Avalue;
    ocolCost = ptr_model.colCost;
    ocolLower = ptr_model.colLower;
    ocolUpper = ptr_model.colUpper;
    orowLower = ptr_model.rowLower;
    orowUpper = ptr_model.rowUpper;

    oAcountX = oAvalue.size();
}